

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataLisp.cpp
# Opt level: O2

void __thiscall DL::DataLisp::build(DataLisp *this,DataContainer *container)

{
  DataLisp_Internal *this_00;
  SyntaxTree *pSVar1;
  pointer ppSVar2;
  pointer ppSVar3;
  VM vm;
  VM local_50 [2];
  
  if (this->mInternal->mTree != (SyntaxTree *)0x0) {
    VM::VM(local_50,container,this->mInternal->mLogger);
    pSVar1 = this->mInternal->mTree;
    ppSVar2 = (pSVar1->Nodes).
              super__Vector_base<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    this_00 = (DataLisp_Internal *)(local_50 + 1);
    for (ppSVar3 = (pSVar1->Nodes).
                   super__Vector_base<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppSVar3 != ppSVar2;
        ppSVar3 = ppSVar3 + 1) {
      DataLisp_Internal::buildGroup(this_00,(StatementNode *)this->mInternal,(VM *)*ppSVar3);
      DataContainer::addTopGroup(container,(DataGroup *)this_00);
      DataGroup::~DataGroup((DataGroup *)this_00);
    }
    VM::~VM(local_50);
    return;
  }
  __assert_fail("(mInternal->mTree)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/PearCoding[P]DataLisp/src/DataLisp.cpp"
                ,0x192,"void DL::DataLisp::build(DataContainer &)");
}

Assistant:

void DataLisp::build(DataContainer& container)
{
	DL_ASSERT(mInternal->mTree);

	VM vm(container, mInternal->mLogger);
	for (StatementNode* ptr : mInternal->mTree->Nodes) {
		container.addTopGroup(mInternal->buildGroup(ptr, vm));
	}
}